

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O2

void __thiscall pg::TSPMSolver::update(TSPMSolver *this,int pl)

{
  int iVar1;
  Game *pGVar2;
  int *a;
  int *b;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  char *pcVar13;
  int i;
  int m;
  uint local_94;
  int local_90;
  int local_8c;
  long local_88;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&q);
  m = 0;
  local_94 = pl;
  do {
    uVar9 = (ulong)m;
    local_88 = (long)pl;
    if (((this->super_Solver).game)->n_vertices <= (long)uVar9) {
      do {
        lVar12 = local_88;
        if (q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
            ._M_cur) {
          for (uVar9 = 0; pGVar2 = (this->super_Solver).game, (long)uVar9 < pGVar2->n_vertices;
              uVar9 = uVar9 + 1) {
            if (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) &&
               (this->unstable[uVar9] == 0)) {
              piVar6 = this->pms;
              lVar10 = this->k * uVar9 - lVar12;
              if (piVar6[lVar10 + 1] != -1) {
                uVar4 = pGVar2->_priority[uVar9];
                if ((uVar4 & 1) != local_94) {
                  this->counts[(int)uVar4] = this->counts[(int)uVar4] + -1;
                }
                piVar6[lVar10 + 1] = -1;
                iVar5 = (int)uVar9;
                todo_push(this,iVar5);
                if ((this->super_Solver).trace != 0) {
                  poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mupdated node ");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                  poVar7 = std::operator<<(poVar7,"/");
                  poVar7 = (ostream *)
                           std::ostream::operator<<
                                     (poVar7,((this->super_Solver).game)->_priority[uVar9]);
                  iVar5 = Solver::owner(&this->super_Solver,iVar5);
                  pcVar13 = " (odd)";
                  if (iVar5 == 0) {
                    pcVar13 = " (even)";
                  }
                  poVar7 = std::operator<<(poVar7,pcVar13);
                  std::operator<<(poVar7,"\x1b[m to");
                  pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar9);
                  std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
                }
              }
            }
          }
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                    ((_Deque_base<int,_std::allocator<int>_> *)&q);
          return;
        }
        iVar5 = *q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                 _M_start._M_cur;
        std::deque<int,_std::allocator<int>_>::pop_front(&q.c);
        pGVar2 = (this->super_Solver).game;
        piVar6 = pGVar2->_inedges + pGVar2->_firstins[iVar5];
        while( true ) {
          iVar5 = *piVar6;
          uVar9 = (ulong)iVar5;
          if (uVar9 == 0xffffffffffffffff) break;
          m = iVar5;
          if (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) &&
             (this->unstable[uVar9] == 0)) {
            uVar4 = Solver::owner(&this->super_Solver,iVar5);
            iVar5 = m;
            if (uVar4 != local_94) {
              pGVar2 = (this->super_Solver).game;
              local_90 = pGVar2->_priority[m];
              piVar11 = pGVar2->_outedges + pGVar2->_firstouts[m];
              local_8c = -1;
              while( true ) {
                iVar5 = m;
                iVar1 = *piVar11;
                uVar9 = (ulong)iVar1;
                if (uVar9 == 0xffffffffffffffff) break;
                if (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0
                    ) && (this->unstable[uVar9] == 0)) {
                  Prog(this,this->tmp,this->pms + this->k * uVar9,local_90,local_94);
                  a = this->tmp;
                  b = this->best;
                  if ((local_8c == -1) || (bVar3 = pm_less(this,a,b,local_90,local_94), bVar3)) {
                    uVar9 = this->k;
                    for (uVar8 = 0; local_8c = iVar1, (~((long)uVar9 >> 0x3f) & uVar9) != uVar8;
                        uVar8 = uVar8 + 1) {
                      b[uVar8] = a[uVar8];
                    }
                  }
                }
                piVar11 = piVar11 + 1;
              }
              if ((local_8c != -1) &&
                 (bVar3 = pm_less(this,this->pms + (long)m * this->k,this->best,local_90,local_94),
                 !bVar3)) goto LAB_0015f953;
            }
            this->unstable[iVar5] = 1;
            std::deque<int,_std::allocator<int>_>::push_back(&q.c,&m);
          }
LAB_0015f953:
          piVar6 = piVar6 + 1;
        }
      } while( true );
    }
    if ((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
      piVar6 = this->unstable;
      piVar6[uVar9] = 0;
      lVar12 = (long)m;
      if (this->pms[this->k * lVar12 + (long)pl] != -1) {
        bVar3 = canlift(this,m,local_94);
        if (!bVar3) goto LAB_0015f78a;
        piVar6 = this->unstable;
        lVar12 = (long)m;
      }
      piVar6[lVar12] = 1;
      std::deque<int,_std::allocator<int>_>::push_back(&q.c,&m);
    }
LAB_0015f78a:
    m = m + 1;
  } while( true );
}

Assistant:

void
TSPMSolver::update(int pl)
{
    std::queue<int> q;

    // find unstable nodes (for measure <pl>)
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        unstable[i] = 0; // first mark as stable
        if (pms[k*i + pl] == -1 or canlift(i, pl)) {
            unstable[i] = 1;
            q.push(i);
        }
    }

    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int m = *curedge;
            if (disabled[m] or unstable[m]) continue;
            if (owner(m) != pl) {
                int best_to = -1;
                const int d = priority(m);
                for (auto curedge = outs(m); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (disabled[to]) continue;
                    if (unstable[to]) continue;
                    Prog(tmp, pms + k*to, d, pl);
                    if (best_to == -1 or pm_less(tmp, best, d, pl)) {
                        for (int i=0; i<k; i++) best[i] = tmp[i];
                        best_to = to;
                    }
                }
                if (best_to != -1 and !pm_less(pms+k*m, best, d, pl)) continue;
            }
            unstable[m] = 1;
            q.push(m);
        }
    }

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        if (unstable[i] == 0 and pms[k*i + 1-pl] != -1) {
            if ((priority(i)&1) != pl) counts[priority(i)]--;
            pms[k*i + 1-pl] = -1;
            todo_push(i);

            if (trace) {
                logger << "\033[1;33mupdated node " << i << "/" << priority(i) << (owner(i)?" (odd)":" (even)") << "\033[m to";
                pm_stream(logger, pms + i*k);
                logger << std::endl;
            }
        }
    }
}